

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text2mecab.c
# Opt level: O1

void text2mecab(char *output,char *input)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  
  sVar2 = strlen(input);
  uVar12 = 0;
  if (0 < (int)sVar2) {
    iVar9 = 0;
    do {
      iVar10 = (int)uVar12;
      pcVar3 = input + iVar10;
      uVar8 = 0;
      do {
        lVar4 = 0;
        cVar5 = *text2mecab_conv_list[uVar8];
        while (cVar5 != '\0') {
          if (pcVar3[lVar4] != cVar5) {
            lVar4 = 0xffffffff;
            break;
          }
          lVar1 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          cVar5 = text2mecab_conv_list[uVar8][lVar1];
        }
        iVar6 = (int)lVar4;
        if (iVar6 != -1) goto LAB_0011ef11;
        uVar8 = uVar8 + 2;
      } while (uVar8 != 0x170);
      iVar6 = -1;
      uVar8 = 0x170;
LAB_0011ef11:
      if (iVar6 == -1) {
        cVar5 = *pcVar3;
        if (cVar5 < '\0') {
          uVar12 = 0;
          do {
            if ((text2mecab_kanji_range[uVar12 + 1] <= cVar5) &&
               (cVar5 <= text2mecab_kanji_range[uVar12 + 2])) {
              iVar6 = (int)text2mecab_kanji_range[uVar12];
              goto LAB_0011ef79;
            }
            uVar8 = uVar12 & 0x3f;
            uVar12 = uVar12 + 3;
          } while ((9UL >> uVar8 & 1) != 0);
          iVar6 = -1;
LAB_0011ef79:
          if (iVar6 < 1) {
            fwrite("WARNING: text2mecab() in text2mecab.c: Wrong character.\n",0x38,1,_stderr);
            goto LAB_0011ef51;
          }
          lVar4 = 0;
          do {
            output[lVar4 + iVar9] = pcVar3[lVar4];
            lVar4 = lVar4 + 1;
            iVar7 = (int)lVar4;
          } while (iVar6 != iVar7);
          iVar9 = iVar9 + iVar7;
          uVar11 = iVar10 + iVar7;
        }
        else {
LAB_0011ef51:
          uVar11 = iVar10 + 1;
        }
        uVar12 = (ulong)uVar11;
      }
      else {
        uVar12 = (ulong)(uint)(iVar6 + iVar10);
        pcVar3 = *(char **)((long)text2mecab_conv_list + ((uVar8 & 0xffffffff) << 3 | 8));
        cVar5 = *pcVar3;
        if (cVar5 != '\0') {
          lVar4 = 0;
          do {
            output[lVar4 + iVar9] = cVar5;
            cVar5 = pcVar3[lVar4 + 1];
            lVar4 = lVar4 + 1;
          } while (cVar5 != '\0');
          iVar9 = iVar9 + (int)lVar4;
        }
      }
    } while ((int)uVar12 < (int)sVar2);
    uVar12 = (ulong)iVar9;
  }
  output[uVar12] = '\0';
  return;
}

Assistant:

void text2mecab(char *output, const char *input)
{
   int i, j;
   const int length = strlen(input);
   const char *str;
   int index = 0;
   int s, e = -1;

   for (s = 0; s < length;) {
      str = &input[s];
      /* search */
      for (i = 0; text2mecab_conv_list[i] != NULL; i += 2) {
         e = strtopcmp(str, text2mecab_conv_list[i]);
         if (e != -1)
            break;
      }
      if (e != -1) {
         /* convert */
         s += e;
         str = text2mecab_conv_list[i + 1];
         for (j = 0; str[j] != '\0'; j++)
            output[index++] = str[j];
      } else if (text2mecab_control_range[0] <= str[0] && str[0] <= text2mecab_control_range[1]) {
         /* control character */
         s++;
      } else {
         /* multi byte character */
         e = -1;
         for (j = 0; text2mecab_kanji_range[j] > 0; j += 3) {
            if (text2mecab_kanji_range[j + 1] <= str[0] && text2mecab_kanji_range[j + 2] >= str[0]) {
               e = text2mecab_kanji_range[j];
               break;
            }
         }
         if (e > 0) {
            for (j = 0; j < e; j++)
               output[index++] = input[s++];
         } else {
            /* unknown */
            fprintf(stderr, "WARNING: text2mecab() in text2mecab.c: Wrong character.\n");
            s++;
         }
      }
   }
   output[index] = '\0';
}